

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O3

void __thiscall QLatin1StringMatcher::setSearcher(QLatin1StringMatcher *this)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  
  if (this->m_cs == CaseSensitive) {
    pcVar2 = (this->m_pattern).m_data;
    uVar3 = (this->m_pattern).m_size;
    uVar7 = 0xff;
    if (uVar3 < 0xff) {
      uVar7 = uVar3;
    }
    memset(&this->field_2,(int)uVar7,0x100);
    if (uVar3 != 0) {
      pbVar8 = (byte *)(pcVar2 + (uVar3 - uVar7));
      uVar5 = (int)uVar7 - 1;
      do {
        bVar1 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        cVar4 = (char)uVar5;
        *(char *)((long)&this->field_2 + (ulong)bVar1) = cVar4;
        uVar5 = (uint)(byte)(cVar4 - 1);
      } while (cVar4 != '\0');
    }
  }
  else {
    uVar3 = (this->m_pattern).m_size;
    uVar7 = 0x100;
    if ((long)uVar3 < 0x100) {
      uVar7 = uVar3;
    }
    if (0 < (long)uVar3) {
      pcVar2 = (this->m_pattern).m_data;
      uVar6 = 0;
      do {
        this->m_foldBuffer[uVar6] = ""[(byte)pcVar2[uVar6]];
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    uVar6 = 0xff;
    if (uVar7 < 0xff) {
      uVar6 = uVar7;
    }
    memset(&this->field_2,(int)uVar6,0x100);
    if (uVar3 != 0) {
      pbVar8 = (byte *)((long)this + (uVar7 - uVar6) + 0x120);
      uVar5 = (int)uVar6 - 1;
      do {
        bVar1 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        cVar4 = (char)uVar5;
        *(char *)((long)&this->field_2 + (ulong)bVar1) = cVar4;
        uVar5 = (uint)(byte)(cVar4 - 1);
      } while (cVar4 != '\0');
    }
  }
  return;
}

Assistant:

void QLatin1StringMatcher::setSearcher() noexcept
{
    if (m_cs == Qt::CaseSensitive) {
        new (&m_caseSensitiveSearcher) CaseSensitiveSearcher(m_pattern.data(), m_pattern.end());
    } else {
        QtPrivate::QCaseInsensitiveLatin1Hash foldCase;
        qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        for (qsizetype i = 0; i < bufferSize; ++i)
            m_foldBuffer[i] = static_cast<char>(foldCase(m_pattern[i].toLatin1()));

        new (&m_caseInsensitiveSearcher)
                CaseInsensitiveSearcher(m_foldBuffer, &m_foldBuffer[bufferSize]);
    }
}